

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O2

ON_NurbsSurface * __thiscall
ON_NurbsCage::IsoSurface(ON_NurbsCage *this,int dir,double c,ON_NurbsSurface *srf)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  double *pdVar4;
  int iVar5;
  int iVar6;
  char *sFormat;
  long lVar7;
  int iVar8;
  int iVar9;
  int *piVar10;
  int iVar11;
  int iVar12;
  int cage_ijk [3];
  long local_b8;
  int *local_b0;
  ON_NurbsCurve nurbs_curve;
  
  if ((uint)dir < 3) {
    iVar2 = this->m_order[(uint)dir];
    if (((1 < iVar2) && (iVar2 <= this->m_cv_count[(uint)dir])) &&
       (this->m_knot[(uint)dir] != (double *)0x0)) {
      iVar9 = (uint)(byte)(0 < this->m_dim & this->m_is_rat) + this->m_dim;
      iVar2 = ON_NurbsSpanIndex(iVar2,this->m_cv_count[(uint)dir],this->m_knot[(uint)dir],c,0,0);
      ON_NurbsCurve::ON_NurbsCurve(&nurbs_curve);
      nurbs_curve.m_dim =
           (this->m_cv_count[0] * iVar9 * this->m_cv_count[1] * this->m_cv_count[2]) /
           this->m_cv_count[(uint)dir];
      nurbs_curve.m_is_rat = 0;
      nurbs_curve.m_order = this->m_order[(uint)dir];
      nurbs_curve.m_cv_count = nurbs_curve.m_order;
      ON_NurbsCurve::ReserveCVCapacity(&nurbs_curve,nurbs_curve.m_order * nurbs_curve.m_dim);
      nurbs_curve.m_cv_stride = nurbs_curve.m_dim;
      ON_NurbsCurve::ManageKnotForExperts(&nurbs_curve,0,this->m_knot[(uint)dir] + iVar2);
      local_b0 = cage_ijk + 1;
      piVar10 = cage_ijk + 2;
      if (dir == 0) {
        local_b8 = 2;
        lVar7 = 1;
      }
      else if (dir == 1) {
        local_b8 = 2;
        local_b0 = cage_ijk;
        lVar7 = 0;
      }
      else {
        piVar10 = cage_ijk + 1;
        local_b0 = cage_ijk;
        local_b8 = 1;
        lVar7 = 0;
      }
      iVar1 = this->m_order[(uint)dir];
      iVar8 = this->m_cv_count[local_b8];
      if (iVar8 < 1) {
        iVar8 = 0;
      }
      iVar11 = iVar2;
      iVar5 = 0;
      if (0 < this->m_cv_count[lVar7]) {
        iVar5 = this->m_cv_count[lVar7];
      }
      for (; iVar11 < iVar1 + iVar2; iVar11 = iVar11 + 1) {
        pdVar3 = ON_NurbsCurve::CV(&nurbs_curve,iVar11 - iVar2);
        cage_ijk[(uint)dir] = iVar11;
        for (iVar6 = 0; iVar6 != iVar5; iVar6 = iVar6 + 1) {
          *local_b0 = iVar6;
          for (iVar12 = 0; iVar8 != iVar12; iVar12 = iVar12 + 1) {
            *piVar10 = iVar12;
            pdVar4 = CV(this,cage_ijk[0],cage_ijk[1],cage_ijk[2]);
            memcpy(pdVar3,pdVar4,(long)(iVar9 * 8));
            pdVar3 = pdVar3 + iVar9;
          }
        }
      }
      if (srf == (ON_NurbsSurface *)0x0) {
        srf = ON_NurbsSurface::New();
      }
      ON_NurbsSurface::Create
                (srf,this->m_dim,this->m_is_rat,this->m_order[lVar7],this->m_order[local_b8],
                 this->m_cv_count[lVar7],this->m_cv_count[local_b8]);
      ON_NurbsCurve::Evaluate(&nurbs_curve,c,0,nurbs_curve.m_dim,srf->m_cv,0,(int *)0x0);
      nurbs_curve.m_knot = (double *)0x0;
      pdVar3 = srf->m_knot[0];
      pdVar4 = this->m_knot[lVar7];
      iVar2 = ON_NurbsSurface::KnotCount(srf,0);
      memcpy(pdVar3,pdVar4,(long)iVar2 << 3);
      pdVar3 = srf->m_knot[1];
      pdVar4 = this->m_knot[local_b8];
      iVar2 = ON_NurbsSurface::KnotCount(srf,1);
      memcpy(pdVar3,pdVar4,(long)iVar2 << 3);
      ON_NurbsCurve::~ON_NurbsCurve(&nurbs_curve);
      return srf;
    }
    sFormat = "ON_NurbsCage::IsoSurface - invalid NURBS cage";
    iVar2 = 0x547;
  }
  else {
    sFormat = "ON_NurbsCage::IsoSurface - invalid dir parameter";
    iVar2 = 0x542;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_nurbsvolume.cpp"
             ,iVar2,"",sFormat);
  return (ON_NurbsSurface *)0x0;
}

Assistant:

ON_NurbsSurface* ON_NurbsCage::IsoSurface(
        int dir,
        double c,
        ON_NurbsSurface* srf
        ) const
{
  // c = 0; cage(c,s,t) = srf(s,t)
  // c = 1; cage(r,c,t) = srf(r,t)
  // c = 2; cage(r,s,c) = srf(r,s)
  if ( dir < 0 || dir > 2 )
  {
    ON_ERROR("ON_NurbsCage::IsoSurface - invalid dir parameter");
    return 0;
  }
  if ( m_order[dir] < 2 || m_cv_count[dir] < m_order[dir] || 0 == m_knot[dir] )
  {
    ON_ERROR("ON_NurbsCage::IsoSurface - invalid NURBS cage");
    return 0;
  }

  const int cage_cvdim = CVSize();

  int span_index = ON_NurbsSpanIndex(m_order[dir],m_cv_count[dir],m_knot[dir],c,0,0);
  ON_NurbsCurve nurbs_curve;
  nurbs_curve.m_dim = cage_cvdim*m_cv_count[0]*m_cv_count[1]*m_cv_count[2]/m_cv_count[dir];
  nurbs_curve.m_is_rat = 0;
  nurbs_curve.m_order = m_order[dir];
  nurbs_curve.m_cv_count = nurbs_curve.m_order;
  nurbs_curve.ReserveCVCapacity(nurbs_curve.m_dim*nurbs_curve.m_cv_count);
  nurbs_curve.m_cv_stride = nurbs_curve.m_dim;
  // nurbs_curve.m_knot[] shares memory with m_knot[dir] + span_index. nurbs_curve destructor does not free nurbs_curve.m_knot[]
  nurbs_curve.ManageKnotForExperts(0, m_knot[dir] + span_index);

  int ii,jj,kk;
  /*
  int i0 = 0;
  int i1 = m_cv_count[0];
  int j0 = 0;
  int j1 = m_cv_count[1];
  int k0 = 0;
  int k1 = m_cv_count[2];
  */

  //int i0 = span_index;
  //int i1 = span_index+m_order[dir];
  ii = dir;
  switch(dir)
  {
  case 0:
    jj = 1;
    kk = 2;
    break;
  case 1:
    jj = 0;
    kk = 2;
    break;
  case 2:
    jj = 0;
    kk = 1;
    break;
  default: // to keep lint happy
    ii = 0;
    jj = 1;
    kk = 2;
    break;
  };


  double* cv;
  const int cage_sizeofcv = cage_cvdim*sizeof(*cv);
  //int i0 = span_index;
  int i1 = span_index+m_order[ii];
  int j1 = m_cv_count[jj];
  int k1 = m_cv_count[kk];

  int i,j,k;
  int cage_ijk[3];
  for ( i = span_index; i < i1; i++) 
  {
    cv = nurbs_curve.CV(i-span_index);
    cage_ijk[ii] = i;
    for ( j = 0; j < j1; j++ ) 
    {
      cage_ijk[jj] = j;
      for ( k = 0; k < k1; k++ )
      {
        cage_ijk[kk] = k;
        memcpy(cv,CV(cage_ijk[0],cage_ijk[1],cage_ijk[2]),cage_sizeofcv);
        cv += cage_cvdim;
      }
    }
  }

  ON_NurbsSurface* iso_srf = srf ? srf : ON_NurbsSurface::New();
  iso_srf->Create(m_dim,m_is_rat,m_order[jj],m_order[kk],m_cv_count[jj],m_cv_count[kk]);
  nurbs_curve.Evaluate(c,0,nurbs_curve.m_dim,iso_srf->m_cv,0,0);
  nurbs_curve.m_knot = 0;
  memcpy(iso_srf->m_knot[0],m_knot[jj],iso_srf->KnotCount(0)*sizeof(*iso_srf->m_knot[0]));
  memcpy(iso_srf->m_knot[1],m_knot[kk],iso_srf->KnotCount(1)*sizeof(*iso_srf->m_knot[1]));

  return iso_srf;
}